

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O0

Dataset * __thiscall
notch::io::IDXReader::readDataset
          (Dataset *__return_storage_ptr__,IDXReader *this,istream *in,size_t *dims,size_t *shape)

{
  byte bVar1;
  float *__n;
  size_t sVar2;
  uchar *puVar3;
  runtime_error *this_00;
  byte *pbVar4;
  float *pfVar5;
  size_type local_b0;
  size_t j;
  size_t n;
  undefined1 local_98 [8];
  Array sample;
  size_t i_1;
  undefined1 local_78 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  size_t i;
  size_t nSampleSize;
  size_t nSamples;
  size_t *shape_local;
  size_t *dims_local;
  istream *in_local;
  IDXReader *this_local;
  Dataset *dataset;
  
  core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::vector
            (__return_storage_ptr__);
  sVar2 = readDims(this,in);
  *dims = sVar2;
  readShape(this,in,*dims,shape);
  __n = (float *)*shape;
  i = 1;
  for (buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
      buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage < (pointer)*dims;
      buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) {
    i = shape[(long)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage] * i;
  }
  core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::reserve
            (__return_storage_ptr__,(size_type)__n);
  i_1._7_1_ = 0;
  core::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&i_1 + 6));
  core::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78,i,
             (value_type_conflict *)((long)&i_1 + 7),(allocator<unsigned_char> *)((long)&i_1 + 6));
  core::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&i_1 + 6));
  sample._M_data = (float *)0x0;
  while( true ) {
    if (__n <= sample._M_data) {
      core::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
      return __return_storage_ptr__;
    }
    n._4_4_ = 0;
    core::std::valarray<float>::valarray((valarray<float> *)local_98,(float *)((long)&n + 4),i);
    puVar3 = core::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
    std::istream::read((char *)in,(long)puVar3);
    sVar2 = std::istream::gcount();
    if (sVar2 != i) break;
    for (local_b0 = 0; local_b0 < i; local_b0 = local_b0 + 1) {
      pbVar4 = core::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78,local_b0
                         );
      bVar1 = *pbVar4;
      pfVar5 = core::std::valarray<float>::operator[]((valarray<float> *)local_98,local_b0);
      *pfVar5 = (float)bVar1;
    }
    core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::push_back
              (__return_storage_ptr__,(value_type *)local_98);
    core::std::valarray<float>::~valarray((valarray<float> *)local_98);
    sample._M_data = (float *)((long)sample._M_data + 1);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"IDXReader: cannot read data sample");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Dataset readDataset(std::istream &in, size_t *dims, size_t shape[]) {
        Dataset dataset;
        // read shape information
        *dims = readDims(in);
        readShape(in, *dims, shape);
        // calculate sample size in bytes
        size_t nSamples = shape[0];
        size_t nSampleSize = sizeof(uint8_t);
        for (size_t i = 1; i < *dims; ++i) {
            nSampleSize *= shape[i];
        }
        // read all samples
        dataset.reserve(nSamples);
        std::vector<uint8_t> buf(nSampleSize, 0);
        for (size_t i = 0; i < nSamples; ++i) {
            Array sample(0.0, nSampleSize);
            in.read((char*)buf.data(), nSampleSize);
            size_t n = in.gcount();
            if (n != nSampleSize) {
                throw std::runtime_error("IDXReader: cannot read data sample");
            }
            for (size_t j = 0; j < nSampleSize; ++j) {
                sample[j] = buf[j]; // convert uint8_t to float
            }
            dataset.push_back(sample);
        }
        return dataset;
    }